

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

bool ft::
     lexicographical_compare<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::less<int>>
               (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first1,
               treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last1,
               treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first2,
               treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last2)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  type *param_6_local;
  type *param_5_local;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last2_local;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first2_local;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last1_local;
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first1_local;
  
  while( true ) {
    bVar1 = operator!=(first1,last1);
    if (!bVar1) {
      bVar1 = operator!=(first2,last2);
      return bVar1;
    }
    bVar1 = operator==(first2,last2);
    if (bVar1) {
      return false;
    }
    pvVar2 = constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                       ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)first2);
    pvVar3 = constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                       ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)first1);
    bVar1 = less<int>::operator()((less<int> *)((long)&first1_local + 6),pvVar2,pvVar3);
    if (bVar1) {
      return false;
    }
    pvVar2 = constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                       ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)first1);
    pvVar3 = constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                       ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)first2);
    bVar1 = less<int>::operator()((less<int> *)((long)&first1_local + 6),pvVar2,pvVar3);
    if (bVar1) break;
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first1);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first2);
  }
  return true;
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2, Compare comp,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (first2 == last2 || comp(*first2, *first1)) return false;
		else if (comp(*first1, *first2)) return true;
		++first1; ++first2;
	}
	return first2 != last2;
}